

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisRegular.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridAxisRegular::Encode(GridAxisRegular *this,KDataStream *stream)

{
  KDataStream::Write<double>(stream,(double)this->m_f64DomainInitialXi);
  KDataStream::Write<double>(stream,(double)this->m_f64DomainFinalXi);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16DomainPointsXi);
  KDataStream::Write(stream,this->m_ui8InterleafFactor);
  KDataStream::Write(stream,this->m_ui8AxisType);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumPoints);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16InitialIndex);
  return;
}

Assistant:

void GridAxisRegular::Encode( KDataStream & stream ) const
{
    stream << m_f64DomainInitialXi
           << m_f64DomainFinalXi
           << m_ui16DomainPointsXi
           << m_ui8InterleafFactor
           << m_ui8AxisType
           << m_ui16NumPoints
           << m_ui16InitialIndex;
}